

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O2

bool __thiscall Rml::ElementScroll::CreateCorner(ElementScroll *this)

{
  ElementPtr this_00;
  Element *pEVar1;
  allocator<char> local_aa;
  allocator<char> local_a9;
  ElementPtr corner_element;
  ElementPtr local_a0;
  Property local_98;
  XMLAttributes local_48;
  String local_30;
  
  if (this->corner == (Element *)0x0) {
    pEVar1 = this->element;
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"*",&local_a9);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"scrollbarcorner",&local_aa);
    local_48.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Factory::InstanceElement
              ((Factory *)&corner_element,pEVar1,(String *)&local_98,&local_30,&local_48);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_48.m_container);
    ::std::__cxx11::string::~string((string *)&local_30);
    ::std::__cxx11::string::~string((string *)&local_98);
    this_00 = corner_element;
    this->corner = (Element *)
                   corner_element._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    Property::Property<int>(&local_98,1,NUMBER,-1);
    Element::SetProperty
              ((Element *)
               this_00._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,Clip,&local_98);
    Property::~Property(&local_98);
    pEVar1 = this->corner;
    Property::Property<Rml::Style::Drag,Rml::Style::Drag>(&local_98,Block);
    Element::SetProperty(pEVar1,Drag,&local_98);
    Property::~Property(&local_98);
    local_a0 = (ElementPtr)
               (ElementPtr)
               corner_element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
               ._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    corner_element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0;
    pEVar1 = Element::AppendChild(this->element,&local_a0,false);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_a0);
    UpdateScrollElementProperties(this,pEVar1);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&corner_element);
  }
  return true;
}

Assistant:

bool ElementScroll::CreateCorner()
{
	if (corner != nullptr)
		return true;

	ElementPtr corner_element = Factory::InstanceElement(element, "*", "scrollbarcorner", XMLAttributes());
	corner = corner_element.get();
	corner->SetProperty(PropertyId::Clip, Property(1, Unit::NUMBER));
	corner->SetProperty(PropertyId::Drag, Property(Style::Drag::Block));

	Element* child = element->AppendChild(std::move(corner_element), false);
	UpdateScrollElementProperties(child);

	return true;
}